

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Str_t * Gia_AigerWriteMappingDoc(Gia_Man_t *p)

{
  int iVar1;
  uchar *pPos;
  int *piVar2;
  Vec_Str_t *pVVar3;
  int local_34;
  int local_30;
  int nSize2;
  int nSize;
  int LutSize;
  int nLuts;
  int iFan;
  int k;
  int i;
  uchar *pBuffer;
  Gia_Man_t *p_local;
  
  nSize = 0;
  nSize2 = 0;
  local_30 = 2;
  for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      nSize = nSize + 1;
      iVar1 = Gia_ObjLutSize(p,iFan);
      local_30 = iVar1 + 2 + local_30;
      iVar1 = Gia_ObjLutSize(p,iFan);
      nSize2 = Abc_MaxInt(nSize2,iVar1);
    }
  }
  pPos = (uchar *)malloc((long)(local_30 << 2));
  Gia_AigerWriteInt(pPos,nSize);
  local_34 = 2;
  Gia_AigerWriteInt(pPos + 4,nSize2);
  for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      Gia_AigerWriteInt(pPos + (local_34 << 2),iFan);
      iVar1 = Gia_ObjLutSize(p,iFan);
      Gia_AigerWriteInt(pPos + (local_34 + 1) * 4,iVar1);
      local_34 = local_34 + 2;
      for (nLuts = 0; iVar1 = Gia_ObjLutSize(p,iFan), nLuts < iVar1; nLuts = nLuts + 1) {
        piVar2 = Gia_ObjLutFanins(p,iFan);
        Gia_AigerWriteInt(pPos + (local_34 << 2),piVar2[nLuts]);
        local_34 = local_34 + 1;
      }
    }
  }
  if (local_34 == local_30) {
    pVVar3 = Vec_StrAllocArray((char *)pPos,local_30 << 2);
    return pVVar3;
  }
  __assert_fail("nSize2 == nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0x11f,"Vec_Str_t *Gia_AigerWriteMappingDoc(Gia_Man_t *)");
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p )
{
    unsigned char * pBuffer;
    int i, k, iFan, nLuts = 0, LutSize = 0, nSize = 2, nSize2 = 0;
    Gia_ManForEachLut( p, i )
    {
        nLuts++;
        nSize += Gia_ObjLutSize(p, i) + 2;
        LutSize = Abc_MaxInt( LutSize, Gia_ObjLutSize(p, i) );
    }
    pBuffer = ABC_ALLOC( unsigned char, 4 * nSize );
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, nLuts );  
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, LutSize );
    Gia_ManForEachLut( p, i )
    {
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, i );
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_AigerWriteInt( pBuffer + 4 * nSize2++, iFan );
    }
    assert( nSize2 == nSize );
    return Vec_StrAllocArray( (char *)pBuffer, 4*nSize );
}